

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

ElementSize capnp::anon_unknown_71::elementSizeFor(Which elementType)

{
  ElementSize EVar1;
  undefined6 in_register_0000003a;
  Fault f;
  Fault local_10;
  
  switch((int)CONCAT62(in_register_0000003a,elementType)) {
  case 1:
    EVar1 = BIT;
    break;
  case 2:
  case 6:
    EVar1 = BYTE;
    break;
  case 3:
  case 7:
  case 0xf:
    EVar1 = TWO_BYTES;
    break;
  case 4:
  case 8:
  case 10:
    EVar1 = FOUR_BYTES;
    break;
  case 5:
  case 9:
  case 0xb:
    EVar1 = EIGHT_BYTES;
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x11:
    EVar1 = POINTER;
    break;
  case 0x10:
    EVar1 = INLINE_COMPOSITE;
    break;
  case 0x12:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5b,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&local_10);
  default:
    EVar1 = VOID;
  }
  return EVar1;
}

Assistant:

ElementSize elementSizeFor(schema::Type::Which elementType) {
  switch (elementType) {
    case schema::Type::VOID: return ElementSize::VOID;
    case schema::Type::BOOL: return ElementSize::BIT;
    case schema::Type::INT8: return ElementSize::BYTE;
    case schema::Type::INT16: return ElementSize::TWO_BYTES;
    case schema::Type::INT32: return ElementSize::FOUR_BYTES;
    case schema::Type::INT64: return ElementSize::EIGHT_BYTES;
    case schema::Type::UINT8: return ElementSize::BYTE;
    case schema::Type::UINT16: return ElementSize::TWO_BYTES;
    case schema::Type::UINT32: return ElementSize::FOUR_BYTES;
    case schema::Type::UINT64: return ElementSize::EIGHT_BYTES;
    case schema::Type::FLOAT32: return ElementSize::FOUR_BYTES;
    case schema::Type::FLOAT64: return ElementSize::EIGHT_BYTES;

    case schema::Type::TEXT: return ElementSize::POINTER;
    case schema::Type::DATA: return ElementSize::POINTER;
    case schema::Type::LIST: return ElementSize::POINTER;
    case schema::Type::ENUM: return ElementSize::TWO_BYTES;
    case schema::Type::STRUCT: return ElementSize::INLINE_COMPOSITE;
    case schema::Type::INTERFACE: return ElementSize::POINTER;
    case schema::Type::ANY_POINTER: KJ_FAIL_ASSERT("List(AnyPointer) not supported."); break;
  }

  // Unknown type.  Treat it as zero-size.
  return ElementSize::VOID;
}